

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O1

mz_bool duckdb_miniz::mz_zip_writer_update_zip64_extension_block
                  (mz_zip_array *pNew_ext,mz_zip_archive *pZip,mz_uint8 *pExt,uint32_t ext_len,
                  mz_uint64 *pComp_size,mz_uint64 *pUncomp_size,mz_uint64 *pLocal_header_ofs,
                  mz_uint32 *pDisk_start)

{
  ulong min_new_capacity;
  size_t sVar1;
  bool bVar2;
  mz_bool mVar3;
  uint uVar4;
  void *pvVar5;
  size_t new_capacity;
  ulong uVar6;
  mz_uint64 *pmVar7;
  long lVar8;
  undefined2 local_78;
  short sStack_76;
  mz_uint64 local_74 [8];
  
  uVar6 = (ulong)(ext_len + 0x40);
  if (pNew_ext->m_capacity < uVar6) {
    pvVar5 = (*pZip->m_pRealloc)(pZip->m_pAlloc_opaque,pNew_ext->m_p,
                                 (size_t)pNew_ext->m_element_size,uVar6);
    if (pvVar5 == (void *)0x0) {
      if (pZip == (mz_zip_archive *)0x0) {
        return 0;
      }
      pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
      return 0;
    }
    pNew_ext->m_p = pvVar5;
    pNew_ext->m_capacity = uVar6;
  }
  pNew_ext->m_size = 0;
  if ((pComp_size == (mz_uint64 *)0x0 && pUncomp_size == (mz_uint64 *)0x0) &&
      pLocal_header_ofs == (mz_uint64 *)0x0) {
LAB_01879393:
    if (ext_len != 0 && pExt != (mz_uint8 *)0x0) {
      do {
        if (ext_len < 4) {
LAB_018793c1:
          if (pZip != (mz_zip_archive *)0x0) {
            pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
          }
          bVar2 = false;
        }
        else {
          uVar4 = *(ushort *)((long)pExt + 2) + 4;
          if (ext_len < uVar4) goto LAB_018793c1;
          uVar6 = (ulong)uVar4;
          if (*(short *)pExt == 1) {
LAB_01879436:
            pExt = (mz_uint8 *)((long)pExt + uVar6);
            bVar2 = true;
            ext_len = ext_len - uVar4;
          }
          else {
            sVar1 = pNew_ext->m_size;
            min_new_capacity = uVar6 + sVar1;
            if ((min_new_capacity <= pNew_ext->m_capacity) ||
               (mVar3 = mz_zip_array_ensure_capacity(pZip,pNew_ext,min_new_capacity,1), mVar3 != 0))
            {
              pNew_ext->m_size = min_new_capacity;
              switchD_012e1ce8::default
                        ((void *)(sVar1 * pNew_ext->m_element_size + (long)pNew_ext->m_p),pExt,
                         uVar6 * pNew_ext->m_element_size);
              goto LAB_01879436;
            }
            if (pZip != (mz_zip_archive *)0x0) {
              pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
            }
            bVar2 = false;
          }
        }
      } while ((ext_len != 0) && (bVar2));
      if (!bVar2) goto LAB_0187946f;
    }
    mVar3 = 1;
  }
  else {
    if (pUncomp_size == (mz_uint64 *)0x0) {
      pmVar7 = local_74;
    }
    else {
      local_74[0] = *pUncomp_size;
      pmVar7 = local_74 + 1;
    }
    if (pComp_size != (mz_uint64 *)0x0) {
      *pmVar7 = *pComp_size;
      pmVar7 = pmVar7 + 1;
    }
    if (pLocal_header_ofs != (mz_uint64 *)0x0) {
      *pmVar7 = *pLocal_header_ofs;
      pmVar7 = pmVar7 + 1;
    }
    lVar8 = (long)pmVar7 - (long)&local_78;
    _local_78 = CONCAT22((short)lVar8 + -4,1);
    sVar1 = pNew_ext->m_size;
    uVar6 = sVar1 + lVar8;
    if ((pNew_ext->m_capacity < uVar6) &&
       (mVar3 = mz_zip_array_ensure_capacity(pZip,pNew_ext,uVar6,1), mVar3 == 0)) {
      bVar2 = true;
    }
    else {
      pNew_ext->m_size = uVar6;
      bVar2 = false;
    }
    if (!bVar2) {
      switchD_012e1ce8::default
                ((void *)(sVar1 * pNew_ext->m_element_size + (long)pNew_ext->m_p),&local_78,
                 lVar8 * (ulong)pNew_ext->m_element_size);
    }
    if (bVar2 && pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
    }
    if (!bVar2) goto LAB_01879393;
LAB_0187946f:
    mVar3 = 0;
  }
  return mVar3;
}

Assistant:

static mz_bool mz_zip_writer_update_zip64_extension_block(mz_zip_array *pNew_ext, mz_zip_archive *pZip, const mz_uint8 *pExt, uint32_t ext_len, mz_uint64 *pComp_size, mz_uint64 *pUncomp_size, mz_uint64 *pLocal_header_ofs, mz_uint32 *pDisk_start)
{
    /* + 64 should be enough for any new zip64 data */
    if (!mz_zip_array_reserve(pZip, pNew_ext, ext_len + 64, MZ_FALSE))
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

    mz_zip_array_resize(pZip, pNew_ext, 0, MZ_FALSE);

    if ((pUncomp_size) || (pComp_size) || (pLocal_header_ofs) || (pDisk_start))
    {
        mz_uint8 new_ext_block[64];
        mz_uint8 *pDst = new_ext_block;
        mz_write_le16(pDst, MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID);
        mz_write_le16(pDst + sizeof(mz_uint16), 0);
        pDst += sizeof(mz_uint16) * 2;

        if (pUncomp_size)
        {
            mz_write_le64(pDst, *pUncomp_size);
            pDst += sizeof(mz_uint64);
        }

        if (pComp_size)
        {
            mz_write_le64(pDst, *pComp_size);
            pDst += sizeof(mz_uint64);
        }

        if (pLocal_header_ofs)
        {
            mz_write_le64(pDst, *pLocal_header_ofs);
            pDst += sizeof(mz_uint64);
        }

        if (pDisk_start)
        {
            mz_write_le32(pDst, *pDisk_start);
            pDst += sizeof(mz_uint32);
        }

        mz_write_le16(new_ext_block + sizeof(mz_uint16), (mz_uint16)((pDst - new_ext_block) - sizeof(mz_uint16) * 2));

        if (!mz_zip_array_push_back(pZip, pNew_ext, new_ext_block, pDst - new_ext_block))
            return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
    }

    if ((pExt) && (ext_len))
    {
        mz_uint32 extra_size_remaining = ext_len;
        const mz_uint8 *pExtra_data = pExt;

        do
        {
            mz_uint32 field_id, field_data_size, field_total_size;

            if (extra_size_remaining < (sizeof(mz_uint16) * 2))
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

            field_id = MZ_READ_LE16(pExtra_data);
            field_data_size = MZ_READ_LE16(pExtra_data + sizeof(mz_uint16));
            field_total_size = field_data_size + sizeof(mz_uint16) * 2;

            if (field_total_size > extra_size_remaining)
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

            if (field_id != MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID)
            {
                if (!mz_zip_array_push_back(pZip, pNew_ext, pExtra_data, field_total_size))
                    return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);
            }

            pExtra_data += field_total_size;
            extra_size_remaining -= field_total_size;
        } while (extra_size_remaining);
    }

    return MZ_TRUE;
}